

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbsColscale(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  type_conflict5 tVar1;
  int iVar2;
  long in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  Real RVar3;
  int i;
  double in_stack_00000030;
  DataArray<int> *colscaleExp;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *maxi;
  undefined4 in_stack_ffffffffffffff78;
  int exp;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffff90;
  int local_5c;
  undefined8 local_58;
  DataArray<int> *local_50;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 *local_20;
  undefined1 *local_18;
  undefined1 *local_8;
  
  local_50 = *(DataArray<int> **)(in_RSI + 0x10);
  local_58 = 0;
  local_30 = &local_58;
  local_38 = 0;
  pnVar4 = in_RDI;
  local_20 = local_30;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffff90,(double)in_RDI,in_RDI);
  local_5c = 0;
  while (exp = local_5c, iVar2 = DataArray<int>::size(local_50), exp < iVar2) {
    DataArray<int>::operator[](local_50,local_5c);
    RVar3 = spxLdexp((Real)in_RDI,exp);
    spxAbs<double>(RVar3);
    tVar1 = boost::multiprecision::operator>
                      ((double *)CONCAT44(exp,in_stack_ffffffffffffff78),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x5b1fad);
    if (tVar1) {
      DataArray<int>::operator[](local_50,local_5c);
      RVar3 = spxLdexp((Real)in_RDI,exp);
      spxAbs<double>(RVar3);
      local_18 = &stack0xffffffffffffff90;
      local_8 = local_18;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)colscaleExp,in_stack_00000030);
    }
    local_5c = local_5c + 1;
  }
  return pnVar4;
}

Assistant:

R SPxScaler<R>::maxAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R maxi = 0.0;

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) > maxi)
         maxi = spxAbs(spxLdexp(1.0, colscaleExp[i]));


   return maxi;
}